

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderIncompleteLayeredFBOTest::iterate(GeometryShaderIncompleteLayeredFBOTest *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  GLuint *pGVar4;
  bool bVar5;
  uint local_50;
  uint n_incomplete_fbo_id;
  uint n_incomplete_fbo_ids;
  GLuint incomplete_fbo_ids [4];
  bool result;
  Functions *gl;
  GeometryShaderIncompleteLayeredFBOTest *this_local;
  Functions *gl_00;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  bVar5 = true;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
               ,0x152);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pGVar4 = (GLuint *)operator_new__(0x1c);
  this->m_to_ids = pGVar4;
  GeometryShaderLayeredFBOShared::initTOs(gl_00,gl_00->texStorage3DMultisample,this->m_to_ids);
  pGVar4 = (GLuint *)operator_new__(0x10);
  this->m_fbo_ids = pGVar4;
  GeometryShaderLayeredFBOShared::initFBOs
            (gl_00,gl_00->framebufferTexture,this->m_to_ids,this->m_fbo_ids);
  n_incomplete_fbo_id = *this->m_fbo_ids;
  n_incomplete_fbo_ids = this->m_fbo_ids[1];
  incomplete_fbo_ids[0] = this->m_fbo_ids[2];
  incomplete_fbo_ids[1] = this->m_fbo_ids[3];
  for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
    bVar1 = GeometryShaderLayeredFBOShared::checkFBOCompleteness
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,gl_00,
                       (&n_incomplete_fbo_id)[local_50],
                       (this->super_TestCaseBase).m_glExtTokens.FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS
                      );
    bVar5 = (bVar5 & bVar1) != 0;
  }
  if (bVar5 == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderIncompleteLayeredFBOTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Set up texture objects */
	m_to_ids = new glw::GLuint[GeometryShaderLayeredFBOShared::n_shared_to_ids];

	GeometryShaderLayeredFBOShared::initTOs(gl, gl.texStorage3DMultisample, m_to_ids);

	/* Set up framebuffer objects */
	m_fbo_ids = new glw::GLuint[GeometryShaderLayeredFBOShared::n_shared_fbo_ids];

	GeometryShaderLayeredFBOShared::initFBOs(gl, gl.framebufferTexture, m_to_ids, m_fbo_ids);

	/* Verify framebuffer completeness */
	const glw::GLuint  incomplete_fbo_ids[] = { m_fbo_ids[0], m_fbo_ids[1], m_fbo_ids[2], m_fbo_ids[3] };
	const unsigned int n_incomplete_fbo_ids = sizeof(incomplete_fbo_ids) / sizeof(incomplete_fbo_ids[0]);

	for (unsigned int n_incomplete_fbo_id = 0; n_incomplete_fbo_id < n_incomplete_fbo_ids; ++n_incomplete_fbo_id)
	{
		result &= GeometryShaderLayeredFBOShared::checkFBOCompleteness(
			m_testCtx, gl, incomplete_fbo_ids[n_incomplete_fbo_id], m_glExtTokens.FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS);
	} /* for (all FBO ids) */

	/* All done */
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}